

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncCastEmulation.cpp
# Opt level: O1

Function * __thiscall
wasm::FuncCastEmulation::makeThunk(FuncCastEmulation *this,Name name,Module *module,Index numParams)

{
  pointer *ppTVar1;
  undefined8 *puVar2;
  Builder this_00;
  undefined8 *puVar3;
  Function *pFVar4;
  pointer pTVar5;
  Type *pTVar6;
  Expression *value;
  Call *value_00;
  pointer pTVar7;
  int iVar8;
  string_view sVar9;
  Signature SVar10;
  Name name_00;
  undefined1 auStack_248 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> callOperands;
  HeapType local_c0;
  Type local_b8;
  Type local_b0;
  char *local_a8;
  Builder local_a0;
  Builder builder;
  pointer *local_78;
  Type TStack_70;
  pointer local_68 [2];
  undefined1 auStack_58 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> thunkParams;
  _Head_base<0UL,_wasm::Function_*,_false> local_38;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> thunkFunc;
  
  auStack_58 = (undefined1  [8])
               &thunkParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                super__Vector_impl_data._M_finish;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_58,"byn$fpcast-emu$","");
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,name.super_IString.str._M_str,
             name.super_IString.str._M_str + name.super_IString.str._M_len);
  pTVar5 = (pointer)((long)&(thunkParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>
                             ._M_impl.super__Vector_impl_data._M_start)->id + TStack_70.id);
  ppTVar1 = &thunkParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_finish;
  pTVar7 = (pointer)0xf;
  if (auStack_58 != (undefined1  [8])ppTVar1) {
    pTVar7 = thunkParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  if (pTVar7 < pTVar5) {
    pTVar7 = (pointer)0xf;
    if (local_78 != local_68) {
      pTVar7 = local_68[0];
    }
    if (pTVar5 <= pTVar7) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)auStack_58);
      goto LAB_0086f0fe;
    }
  }
  puVar3 = (undefined8 *)std::__cxx11::string::_M_append(auStack_58,(ulong)local_78);
LAB_0086f0fe:
  auStack_248 = (undefined1  [8])
                &callOperands.
                 super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
                 .super__Vector_impl_data._M_finish;
  puVar2 = puVar3 + 2;
  if ((pointer *)*puVar3 == (pointer *)puVar2) {
    callOperands.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)*puVar2;
    callOperands.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)puVar3[3];
  }
  else {
    callOperands.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)*puVar2;
    auStack_248 = (undefined1  [8])*puVar3;
  }
  callOperands.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)puVar3[1];
  *puVar3 = puVar2;
  puVar3[1] = 0;
  *(undefined1 *)puVar2 = 0;
  sVar9._M_str = (char *)0x0;
  sVar9._M_len = (size_t)auStack_248;
  sVar9 = IString::interned((IString *)
                            callOperands.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,sVar9,SUB81(puVar2,0));
  if (auStack_248 !=
      (undefined1  [8])
      &callOperands.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
       _M_impl.super__Vector_impl_data._M_finish) {
    operator_delete((void *)auStack_248,
                    (long)callOperands.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 1);
  }
  if (local_78 != local_68) {
    operator_delete(local_78,(ulong)((long)&local_68[0]->id + 1));
  }
  if (auStack_58 != (undefined1  [8])ppTVar1) {
    operator_delete((void *)auStack_58,
                    (ulong)((long)&(thunkParams.
                                    super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                    _M_impl.super__Vector_impl_data._M_finish)->id + 1));
  }
  local_a8 = (char *)sVar9._M_len;
  pFVar4 = Module::getFunctionOrNull(module,(Name)sVar9);
  if (pFVar4 == (Function *)0x0) {
    pFVar4 = Module::getFunction(module,name);
    SVar10 = HeapType::getSignature(&pFVar4->type);
    local_b0 = SVar10.results.id;
    auStack_248 = (undefined1  [8])0x0;
    callOperands.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    callOperands.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a0.wasm = module;
    builder.wasm = module;
    SVar10 = HeapType::getSignature(&pFVar4->type);
    local_78 = (pointer *)SVar10.params.id;
    thunkParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    auStack_58 = (undefined1  [8])&local_78;
    pTVar5 = (pointer)wasm::Type::size((Type *)&local_78);
    if ((thunkParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
         super__Vector_impl_data._M_start != pTVar5) || (auStack_58 != (undefined1  [8])&local_78))
    {
      iVar8 = 0;
      do {
        do {
          pTVar6 = wasm::Type::Iterator::operator*((Iterator *)auStack_58);
          value = (Expression *)MixedArena::allocSpace(&(local_a0.wasm)->allocator,0x18,8);
          value->_id = LocalGetId;
          *(int *)(value + 1) = iVar8;
          (value->type).id = 3;
          local_38._M_head_impl = (Function *)fromABI(value,(Type)pTVar6->id,builder.wasm);
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          emplace_back<wasm::Expression*>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_248,
                     (Expression **)&local_38);
          thunkParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)((long)&(thunkParams.
                                 super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl
                                 .super__Vector_impl_data._M_start)->id + 1);
          iVar8 = iVar8 + 1;
        } while (thunkParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                 super__Vector_impl_data._M_start != pTVar5);
      } while (auStack_58 != (undefined1  [8])&local_78);
    }
    value_00 = Builder::makeCall(&local_a0,name,
                                 (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                                 auStack_248,local_b0,false);
    auStack_58 = (undefined1  [8])0x0;
    thunkParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    thunkParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    if (numParams != 0) {
      do {
        local_78 = (pointer *)0x3;
        if (thunkParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_start ==
            thunkParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<wasm::Type,_std::allocator<wasm::Type>_>::_M_realloc_insert<wasm::Type>
                    ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_58,
                     (iterator)
                     thunkParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl
                     .super__Vector_impl_data._M_start,(Type *)&local_78);
        }
        else {
          (thunkParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_start)->id = 3;
          thunkParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start =
               thunkParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
        numParams = numParams - 1;
      } while (numParams != 0);
    }
    wasm::Type::Type(&local_b8,(Tuple *)auStack_58);
    SVar10.results.id = 3;
    SVar10.params.id = local_b8.id;
    HeapType::HeapType(&local_c0,SVar10);
    this_00 = builder;
    local_78 = (pointer *)0x0;
    TStack_70.id = 0;
    local_68[0] = (pointer)0x0;
    toABI((Expression *)value_00,builder.wasm);
    name_00.super_IString.str._M_str = local_a8;
    name_00.super_IString.str._M_len = (size_t)&local_38;
    Builder::makeFunction
              (name_00,(HeapType)sVar9._M_str,
               (vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_c0.id,
               (Expression *)&local_78);
    if (local_78 != (pointer *)0x0) {
      operator_delete(local_78,(long)local_68[0] - (long)local_78);
    }
    ((local_38._M_head_impl)->super_Importable).super_Named.hasExplicitName = true;
    pFVar4 = Module::addFunction(this_00.wasm,
                                 (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *
                                 )&local_38);
    if (local_38._M_head_impl != (Function *)0x0) {
      std::default_delete<wasm::Function>::operator()
                ((default_delete<wasm::Function> *)&local_38,local_38._M_head_impl);
    }
    if (auStack_58 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_58,
                      (long)thunkParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)auStack_58);
    }
    if (auStack_248 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_248,
                      (long)callOperands.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_248);
    }
    return pFVar4;
  }
  Fatal::Fatal((Fatal *)auStack_248);
  Fatal::operator<<((Fatal *)auStack_248,
                    (char (*) [103])
                    "FuncCastEmulation::makeThunk seems a thunk name already in use. Was the pass already run on this code?"
                   );
  Fatal::~Fatal((Fatal *)auStack_248);
}

Assistant:

Function* makeThunk(Name name, Module* module, Index numParams) {
    Name thunk = std::string("byn$fpcast-emu$") + name.toString();
    if (module->getFunctionOrNull(thunk)) {
      Fatal() << "FuncCastEmulation::makeThunk seems a thunk name already in "
                 "use. Was the pass already run on this code?";
    }
    // The item in the table may be a function or a function import.
    auto* func = module->getFunction(name);
    Type type = func->getResults();
    Builder builder(*module);
    std::vector<Expression*> callOperands;
    Index i = 0;
    for (const auto& param : func->getParams()) {
      callOperands.push_back(
        fromABI(builder.makeLocalGet(i++, Type::i64), param, module));
    }
    auto* call = builder.makeCall(name, callOperands, type);
    std::vector<Type> thunkParams;
    for (Index i = 0; i < numParams; i++) {
      thunkParams.push_back(Type::i64);
    }
    auto thunkFunc =
      builder.makeFunction(thunk,
                           Signature(Type(thunkParams), Type::i64),
                           {}, // no vars
                           toABI(call, module));
    thunkFunc->hasExplicitName = true;
    return module->addFunction(std::move(thunkFunc));
  }